

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollercoster.cpp
# Opt level: O0

bool convert(char *c,bool *upper)

{
  bool *upper_local;
  char *c_local;
  
  if ((*upper & 1U) == 0) {
    if ((*c < '[') && ('@' < *c)) {
      *c = *c + ' ';
      return true;
    }
    if ((*c < '{') && ('`' < *c)) {
      return true;
    }
  }
  else {
    if ((((*upper & 1U) != 0) && (*c < '{')) && ('`' < *c)) {
      *c = *c + -0x20;
      return true;
    }
    if ((*c < '[') && ('@' < *c)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool convert( char& c, bool& upper){
    if(!upper) {
        if (c <= 'Z' && c >= 'A') {
            c = c - ('Z' - 'z');
            return true;
        } else if(c <= 'z' && c >= 'a'){
            return true;
        }
    } else {
        if (upper && c <= 'z' && c >= 'a') {
            c = c + ('Z' - 'z');
            return true;
        } else if (c <= 'Z' && c >= 'A'){
            return true;
        }
    }
    return false;
}